

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O0

Abc_Obj_t * Abc_NtkBddDecompose(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,int nLutSize,int fVerbose)

{
  DdManager *dd_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar5;
  DdNode *bCof_00;
  int local_fc;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aStack_f8;
  int i;
  Abc_Obj_t *pCofs [20];
  Abc_Ntk_t *local_50;
  Abc_Obj_t *pNodeNew;
  DdNode *bCof;
  DdManager *dd;
  Vec_Ptr_t *vUniq;
  Vec_Ptr_t *vCofs;
  int fVerbose_local;
  int nLutSize_local;
  Abc_Obj_t *pNode_local;
  Abc_Ntk_t *pNtkNew_local;
  
  dd_00 = (DdManager *)pNode->pNtk->pManFunc;
  iVar1 = Abc_ObjFaninNum(pNode);
  if (iVar1 <= nLutSize) {
    __assert_fail("Abc_ObjFaninNum(pNode) > nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                  ,0x253,"Abc_Obj_t *Abc_NtkBddDecompose(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
  }
  iVar1 = Abc_ObjFaninNum(pNode);
  if ((iVar1 == nLutSize + 1) &&
     (pNtkNew_local = (Abc_Ntk_t *)Abc_NtkBddFindCofactor(pNtkNew,pNode,nLutSize),
     pNtkNew_local != (Abc_Ntk_t *)0x0)) {
    if (fVerbose != 0) {
      uVar2 = Abc_ObjFaninNum(pNode);
      uVar3 = Abc_ObjId(pNode);
      printf("Decomposing %d-input node %d using MUX.\n",(ulong)uVar2,(ulong)uVar3);
    }
  }
  else {
    vUniq = Abc_NtkBddCofactors(dd_00,(DdNode *)(pNode->field_5).pData,nLutSize);
    p = Vec_PtrDup(vUniq);
    Vec_PtrUniqify(p,Vec_PtrSortCompare);
    iVar1 = Vec_PtrSize(p);
    if (1 << ((char)nLutSize - 2U & 0x1f) < iVar1) {
      Vec_PtrFree(vUniq);
      vUniq = Abc_NtkBddCofactors(dd_00,(DdNode *)(pNode->field_5).pData,2);
      if (fVerbose != 0) {
        uVar2 = Abc_ObjFaninNum(pNode);
        uVar3 = Abc_ObjId(pNode);
        uVar4 = Vec_PtrSize(vUniq);
        printf("Decomposing %d-input node %d using cofactoring with %d cofactors.\n",(ulong)uVar2,
               (ulong)uVar3,(ulong)uVar4);
      }
      pAVar5 = Abc_ObjFanin(pNode,0);
      aStack_f8 = pAVar5->field_6;
      pAVar5 = Abc_ObjFanin(pNode,1);
      pCofs[0] = (pAVar5->field_6).pCopy;
      for (local_fc = 0; iVar1 = Vec_PtrSize(vUniq), local_fc < iVar1; local_fc = local_fc + 1) {
        bCof_00 = (DdNode *)Vec_PtrEntry(vUniq,local_fc);
        pAVar5 = Abc_NtkCreateCofLut(pNtkNew,dd_00,bCof_00,pNode,2);
        pCofs[(long)(local_fc + 2) + -1] = pAVar5;
      }
      if (nLutSize == 4) {
        local_50 = (Abc_Ntk_t *)Abc_NtkBddMux412(pNtkNew,(Abc_Obj_t **)&stack0xffffffffffffff08);
      }
      else if (nLutSize == 5) {
        local_50 = (Abc_Ntk_t *)Abc_NtkBddMux412a(pNtkNew,(Abc_Obj_t **)&stack0xffffffffffffff08);
      }
      else {
        if (nLutSize != 6) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                        ,0x279,"Abc_Obj_t *Abc_NtkBddDecompose(Abc_Ntk_t *, Abc_Obj_t *, int, int)")
          ;
        }
        local_50 = (Abc_Ntk_t *)Abc_NtkBddMux411(pNtkNew,(Abc_Obj_t **)&stack0xffffffffffffff08);
      }
    }
    else {
      if (fVerbose != 0) {
        uVar2 = Abc_ObjFaninNum(pNode);
        uVar3 = Abc_ObjId(pNode);
        uVar4 = Vec_PtrSize(p);
        printf("Decomposing %d-input node %d using Curtis with %d unique columns.\n",(ulong)uVar2,
               (ulong)uVar3,(ulong)uVar4);
      }
      local_50 = (Abc_Ntk_t *)Abc_NtkBddCurtis(pNtkNew,pNode,vUniq,p);
    }
    Vec_PtrFree(vUniq);
    Vec_PtrFree(p);
    pNtkNew_local = local_50;
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NtkBddDecompose( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, int nLutSize, int fVerbose )
{
    Vec_Ptr_t * vCofs, * vUniq;
    DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
    DdNode * bCof;
    Abc_Obj_t * pNodeNew = NULL;
    Abc_Obj_t * pCofs[20];
    int i;
    assert( Abc_ObjFaninNum(pNode) > nLutSize );
    // try to decompose with two LUTs (the best case for Supp = LutSize + 1)
    if ( Abc_ObjFaninNum(pNode) == nLutSize + 1 )
    {

        pNodeNew = Abc_NtkBddFindCofactor( pNtkNew, pNode, nLutSize );
        if ( pNodeNew != NULL )
        {
            if ( fVerbose )
            printf( "Decomposing %d-input node %d using MUX.\n",
                Abc_ObjFaninNum(pNode), Abc_ObjId(pNode) );
            return pNodeNew;
        }

    }
    // cofactor w.r.t. the bound set variables
    vCofs = Abc_NtkBddCofactors( dd, (DdNode *)pNode->pData, nLutSize );
    vUniq = Vec_PtrDup( vCofs );
    Vec_PtrUniqify( vUniq, (int (*)())Vec_PtrSortCompare );
    // only perform decomposition with it is support reduring with two less vars
    if( Vec_PtrSize(vUniq) > (1 << (nLutSize-2)) )
    {
        Vec_PtrFree( vCofs );
        vCofs = Abc_NtkBddCofactors( dd, (DdNode *)pNode->pData, 2 );
        if ( fVerbose )
        printf( "Decomposing %d-input node %d using cofactoring with %d cofactors.\n",
            Abc_ObjFaninNum(pNode), Abc_ObjId(pNode), Vec_PtrSize(vCofs) );
        // implement the cofactors
        pCofs[0] = Abc_ObjFanin(pNode, 0)->pCopy;
        pCofs[1] = Abc_ObjFanin(pNode, 1)->pCopy;
        Vec_PtrForEachEntry( DdNode *, vCofs, bCof, i )
            pCofs[2+i] = Abc_NtkCreateCofLut( pNtkNew, dd, bCof, pNode, 2 );
        if ( nLutSize == 4 )
            pNodeNew = Abc_NtkBddMux412( pNtkNew, pCofs );
        else if ( nLutSize == 5 )
            pNodeNew = Abc_NtkBddMux412a( pNtkNew, pCofs );
        else if ( nLutSize == 6 )
            pNodeNew = Abc_NtkBddMux411( pNtkNew, pCofs );
        else  assert( 0 );
    }
    // alternative decompose using MUX-decomposition
    else
    {
        if ( fVerbose )
        printf( "Decomposing %d-input node %d using Curtis with %d unique columns.\n",
            Abc_ObjFaninNum(pNode), Abc_ObjId(pNode), Vec_PtrSize(vUniq) );
        pNodeNew = Abc_NtkBddCurtis( pNtkNew, pNode, vCofs, vUniq );
    }
    Vec_PtrFree( vCofs );
    Vec_PtrFree( vUniq );
    return pNodeNew;
}